

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Sigma.cpp
# Opt level: O3

double __thiscall chrono::ChFunction_Sigma::Get_y_dx(ChFunction_Sigma *this,double x)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  
  dVar1 = this->start;
  dVar4 = 0.0;
  if ((dVar1 <= x) && (x <= this->end)) {
    dVar4 = this->amp;
    dVar2 = this->end - dVar1;
    dVar1 = x - dVar1;
    auVar5._0_8_ = dVar1 / (dVar2 * dVar2);
    dVar2 = pow(dVar2,3.0);
    auVar5._8_8_ = 0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = ((dVar1 * dVar1) / dVar2) * -6.0;
    auVar3 = vfmadd231sd_fma(auVar3,auVar5,ZEXT816(0x4018000000000000));
    dVar4 = auVar3._0_8_ * dVar4;
  }
  return dVar4;
}

Assistant:

double ChFunction_Sigma::Get_y_dx(double x) const {
    double ret;
    double A = (end - start);
    if ((x < start) || (x > end))
        ret = 0;
    else {
        ret = amp * (6 * ((x - start) / pow(A, 2)) - 6 * (pow((x - start), 2) / pow(A, 3)));
    }
    return ret;
}